

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

int Tim_ManBlackBoxNum(Tim_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int i;
  Vec_Ptr_t *p_00;
  
  p_00 = p->vBoxes;
  iVar3 = 0;
  if ((p_00 != (Vec_Ptr_t *)0x0) && (iVar1 = p_00->nSize, iVar3 = 0, iVar1 != 0)) {
    iVar3 = 0;
    for (i = 0; i < iVar1; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p_00,i);
      iVar3 = iVar3 + *(int *)((long)pvVar2 + 0x18);
      p_00 = p->vBoxes;
      iVar1 = p_00->nSize;
    }
  }
  return iVar3;
}

Assistant:

int Tim_ManBlackBoxNum( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    int i, Counter = 0;
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
            Counter += pBox->fBlack;
    return Counter;
}